

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# samplers_test.cpp
# Opt level: O1

void __thiscall
ZSobolSampler_ElementaryIntervals_Test::~ZSobolSampler_ElementaryIntervals_Test
          (ZSobolSampler_ElementaryIntervals_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(ZSobolSampler, ElementaryIntervals) {
    for (auto rand :
         {RandomizeStrategy::None, RandomizeStrategy::Owen, RandomizeStrategy::PermuteDigits})
        for (int logSamples = 2; logSamples <= 10; ++logSamples)
            checkElementarySampler("ZSobolSampler",
                                   new ZSobolSampler(1 << logSamples, Point2i(10, 10), rand),
                                   logSamples, 1);
}